

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::PackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  ulong arg;
  PackedArrayType *this;
  SyntaxNode *node;
  PackedArrayType *in_RSI;
  Diagnostic *in_RDI;
  SyntaxNode *syntax;
  PackedArrayType *result;
  uint64_t fullWidth;
  optional<unsigned_int> width;
  Compilation *comp;
  SourceRange in_stack_000000a0;
  undefined8 in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff60;
  Type *in_stack_ffffffffffffff68;
  ConstantRange *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar4;
  BumpAllocator *this_00;
  __unspec local_39;
  undefined4 local_38;
  type_conflict local_31;
  _Optional_payload_base<unsigned_int> local_30;
  Compilation *local_28;
  PackedArrayType *local_20;
  Diagnostic *local_18;
  PackedArrayType *local_8;
  
  this_00 = (BumpAllocator *)&stack0x00000008;
  local_20 = in_RSI;
  local_18 = in_RDI;
  bVar1 = Type::isError((Type *)0x5768b9);
  if (bVar1) {
    local_8 = local_20;
  }
  else {
    local_28 = Scope::getCompilation((Scope *)local_18);
    bVar2 = Type::getBitWidth(in_stack_ffffffffffffff68);
    ConstantRange::width((ConstantRange *)0x576907);
    local_30 = (_Optional_payload_base<unsigned_int>)
               checkedMulU32((uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                             (uint32_t)in_stack_ffffffffffffff58);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x576921);
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
    if (bVar1) {
      local_38 = 0xffffff;
      local_31 = (type_conflict)
                 std::operator<=><unsigned_int,_unsigned_int>
                           ((optional<unsigned_int> *)in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff60);
      std::__cmp_cat::__unspec::__unspec(&local_39,(__unspec *)0x0);
      bVar1 = std::operator>(local_31);
      uVar4 = CONCAT13(bVar1,(int3)uVar4);
    }
    if ((char)((uint)uVar4 >> 0x18) == '\0') {
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x576a3e);
      this = BumpAllocator::
             emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_int>
                       (this_00,(Type *)CONCAT44(uVar4,bVar2),in_stack_ffffffffffffff70,
                        (uint *)in_stack_ffffffffffffff68);
      node = slang::syntax::DeferredSourceRange::syntax((DeferredSourceRange *)0x576a6e);
      local_8 = this;
      if (node != (SyntaxNode *)0x0) {
        Symbol::setSyntax((Symbol *)this,node);
      }
    }
    else {
      bVar3 = Type::getBitWidth(in_stack_ffffffffffffff68);
      arg = (ulong)bVar3;
      ConstantRange::width((ConstantRange *)0x576995);
      slang::syntax::DeferredSourceRange::get((DeferredSourceRange *)CONCAT44(uVar4,bVar2));
      Scope::addDiag((Scope *)dim,(DiagCode)sourceRange.range.startLoc._4_4_,in_stack_000000a0);
      Diagnostic::operator<<<unsigned_long>(local_18,arg);
      Diagnostic::operator<<<unsigned_int>(local_18,(uint)(arg >> 0x20));
      local_8 = (PackedArrayType *)Compilation::getErrorType(local_28);
    }
  }
  return (Type *)local_8;
}

Assistant:

const Type& PackedArrayType::fromDim(const Scope& scope, const Type& elementType, ConstantRange dim,
                                     DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto width = checkedMulU32(elementType.getBitWidth(), dim.width());
    if (!width || width > (uint32_t)SVInt::MAX_BITS) {
        uint64_t fullWidth = uint64_t(elementType.getBitWidth()) * dim.width();
        scope.addDiag(diag::PackedTypeTooLarge, sourceRange.get())
            << fullWidth << (uint32_t)SVInt::MAX_BITS;
        return comp.getErrorType();
    }

    auto result = comp.emplace<PackedArrayType>(elementType, dim, bitwidth_t(*width));
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}